

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_pcm_rb_seek_read(ma_pcm_rb *pRB,ma_uint32 offsetInFrames)

{
  ma_result mVar1;
  
  if (pRB != (ma_pcm_rb *)0x0) {
    mVar1 = ma_rb_seek_read(&pRB->rb,(ulong)(offsetInFrames * pRB->channels *
                                            (&DAT_0017d490)[pRB->format]));
    return mVar1;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_pcm_rb_seek_read(ma_pcm_rb* pRB, ma_uint32 offsetInFrames)
{
    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    return ma_rb_seek_read(&pRB->rb, offsetInFrames * ma_pcm_rb_get_bpf(pRB));
}